

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

Fl_Menu_Item * __thiscall Fl_Menu_::find_item(Fl_Menu_ *this,Fl_Callback *cb)

{
  Fl_Menu_Item *pFVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = -1;
  lVar6 = 0;
  while( true ) {
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      lVar4 = 0;
    }
    else {
      iVar3 = Fl_Menu_Item::size(this->menu_);
      lVar4 = (long)iVar3;
    }
    lVar5 = lVar5 + 1;
    if (lVar4 <= lVar5) break;
    pFVar1 = (Fl_Menu_Item *)((long)&this->menu_->text + lVar6);
    plVar2 = (long *)((long)&this->menu_->callback_ + lVar6);
    lVar6 = lVar6 + 0x38;
    if ((Fl_Callback *)*plVar2 == cb) {
      return pFVar1;
    }
  }
  return (Fl_Menu_Item *)0x0;
}

Assistant:

const Fl_Menu_Item * Fl_Menu_::find_item(Fl_Callback *cb) {
  for ( int t=0; t < size(); t++ ) {
    const Fl_Menu_Item *m = menu_ + t;
    if (m->callback_==cb) {
      return m;
    }
  }
  return (const Fl_Menu_Item *)0;
}